

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O0

void __thiscall
InplaceSolverIslandCallback::processIsland
          (InplaceSolverIslandCallback *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifolds,int numManifolds,int islandId)

{
  int iVar1;
  int iVar2;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  InplaceSolverIslandCallback *in_stack_00000020;
  int i;
  int numCurConstraints;
  btTypedConstraint **startConstraint;
  btPersistentManifold **in_stack_ffffffffffffff98;
  btTypedConstraint *in_stack_ffffffffffffffa0;
  int local_48;
  int local_44;
  long local_40;
  
  if (in_R9D < 0) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))
              (*(long **)(in_RDI + 0x10),in_RSI,in_EDX,in_RCX,in_R8D,*(undefined8 *)(in_RDI + 0x18),
               *(undefined4 *)(in_RDI + 0x20),*(undefined8 *)(in_RDI + 8),
               *(undefined8 *)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x30));
  }
  else {
    local_40 = 0;
    local_44 = 0;
    for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x20); local_48 = local_48 + 1) {
      iVar1 = btGetConstraintIslandId(in_stack_ffffffffffffffa0);
      if (iVar1 == in_R9D) {
        local_40 = *(long *)(in_RDI + 0x18) + (long)local_48 * 8;
        break;
      }
    }
    for (; local_48 < *(int *)(in_RDI + 0x20); local_48 = local_48 + 1) {
      iVar1 = btGetConstraintIslandId(in_stack_ffffffffffffffa0);
      if (iVar1 == in_R9D) {
        local_44 = local_44 + 1;
      }
    }
    if (*(int *)(*(long *)(in_RDI + 8) + 0x48) < 2) {
      (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))
                (*(long **)(in_RDI + 0x10),in_RSI,in_EDX,in_RCX,in_R8D,local_40,local_44,
                 *(undefined8 *)(in_RDI + 8),*(undefined8 *)(in_RDI + 0x28),
                 *(undefined8 *)(in_RDI + 0x30));
    }
    else {
      for (local_48 = 0; local_48 < in_EDX; local_48 = local_48 + 1) {
        btAlignedObjectArray<btCollisionObject_*>::push_back
                  ((btAlignedObjectArray<btCollisionObject_*> *)in_stack_ffffffffffffffa0,
                   (btCollisionObject **)in_stack_ffffffffffffff98);
      }
      for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
        btAlignedObjectArray<btPersistentManifold_*>::push_back
                  ((btAlignedObjectArray<btPersistentManifold_*> *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
      }
      for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
        btAlignedObjectArray<btTypedConstraint_*>::push_back
                  ((btAlignedObjectArray<btTypedConstraint_*> *)in_stack_ffffffffffffffa0,
                   (btTypedConstraint **)in_stack_ffffffffffffff98);
      }
      iVar1 = btAlignedObjectArray<btTypedConstraint_*>::size
                        ((btAlignedObjectArray<btTypedConstraint_*> *)(in_RDI + 0x78));
      iVar2 = btAlignedObjectArray<btPersistentManifold_*>::size
                        ((btAlignedObjectArray<btPersistentManifold_*> *)(in_RDI + 0x58));
      if (*(int *)(*(long *)(in_RDI + 8) + 0x48) < iVar1 + iVar2) {
        processConstraints(in_stack_00000020);
      }
    }
  }
  return;
}

Assistant:

virtual	void	processIsland(btCollisionObject** bodies,int numBodies,btPersistentManifold**	manifolds,int numManifolds, int islandId)
	{
		if (islandId<0)
		{
			///we don't split islands, so all constraints/contact manifolds/bodies are passed into the solver regardless the island id
			m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,&m_sortedConstraints[0],m_numConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
		} else
		{
				//also add all non-contact constraints/joints for this island
			btTypedConstraint** startConstraint = 0;
			int numCurConstraints = 0;
			int i;

			//find the first constraint for this island
			for (i=0;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId(m_sortedConstraints[i]) == islandId)
				{
					startConstraint = &m_sortedConstraints[i];
					break;
				}
			}
			//count the number of constraints in this island
			for (;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId(m_sortedConstraints[i]) == islandId)
				{
					numCurConstraints++;
				}
			}

			if (m_solverInfo->m_minimumSolverBatchSize<=1)
			{
				m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,startConstraint,numCurConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
			} else
			{

				for (i=0;i<numBodies;i++)
					m_bodies.push_back(bodies[i]);
				for (i=0;i<numManifolds;i++)
					m_manifolds.push_back(manifolds[i]);
				for (i=0;i<numCurConstraints;i++)
					m_constraints.push_back(startConstraint[i]);
				if ((m_constraints.size()+m_manifolds.size())>m_solverInfo->m_minimumSolverBatchSize)
				{
					processConstraints();
				} else
				{
					//printf("deferred\n");
				}
			}
		}
	}